

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

uint64_t lj_carith_check64(lua_State *L,int narg,CTypeID *id)

{
  double dVar1;
  CTState *cts;
  CType *pCVar2;
  int iVar3;
  ulong uVar4;
  CTInfo CVar5;
  uint uVar6;
  uint8_t *sp;
  TValue *o;
  uint64_t x;
  
  o = L->base + (long)narg + -1;
  if (L->top <= o) goto LAB_00148837;
  dVar1 = o->n;
  uVar4 = (long)dVar1 >> 0x2f;
  if (uVar4 < 0xfffffffffffffff3) {
LAB_00148719:
    return (ulong)(dVar1 + 6755399441055744.0) & 0xffffffff;
  }
  if (uVar4 == 0xfffffffffffffffb) {
    iVar3 = lj_strscan_num((GCstr *)((ulong)dVar1 & 0x7fffffffffff),o);
    if (iVar3 == 0) {
LAB_00148837:
      lj_err_argt(L,narg,3);
    }
    dVar1 = o->n;
    goto LAB_00148719;
  }
  if (uVar4 != 0xfffffffffffffff5) goto LAB_00148837;
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  uVar4 = (ulong)*(ushort *)((o->u64 & 0x7fffffffffff) + 10);
  sp = (uint8_t *)((o->u64 & 0x7fffffffffff) + 0x10);
  pCVar2 = cts->tab;
  if ((pCVar2[uVar4].info & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    uVar4 = (ulong)(pCVar2[uVar4].info & 0xffff);
  }
  CVar5 = pCVar2[uVar4].info;
  if ((CVar5 & 0xf0000000) == 0x50000000) {
    uVar4 = (ulong)(CVar5 & 0xffff);
    CVar5 = pCVar2[uVar4].info;
  }
  if (((CVar5 & 0xfc800000) == 0x800000) && (pCVar2[uVar4].size == 8)) {
    uVar6 = 0xc;
  }
  else {
    uVar6 = *id;
    if (uVar6 != 0) goto LAB_00148810;
    uVar6 = 0xb;
  }
  *id = uVar6;
LAB_00148810:
  lj_cconv_ct_ct(cts,pCVar2 + uVar6,pCVar2 + uVar4,(uint8_t *)&x,sp,narg << 8);
  return x;
}

Assistant:

uint64_t lj_carith_check64(lua_State *L, int narg, CTypeID *id)
{
  TValue *o = L->base + narg-1;
  if (o >= L->top) {
  err:
    lj_err_argt(L, narg, LUA_TNUMBER);
  } else if (LJ_LIKELY(tvisnumber(o))) {
    /* Handled below. */
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(L);
    uint8_t *sp = (uint8_t *)cdataptr(cdataV(o));
    CTypeID sid = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, sid);
    uint64_t x;
    if (ctype_isref(s->info)) {
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isenum(s->info)) s = ctype_child(cts, s);
    if ((s->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && s->size == 8)
      *id = CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    else if (!*id)
      *id = CTID_INT64;  /* Use int64_t, unless already set. */
    lj_cconv_ct_ct(cts, ctype_get(cts, *id), s,
		   (uint8_t *)&x, sp, CCF_ARG(narg));
    return x;
  } else if (!(tvisstr(o) && lj_strscan_number(strV(o), o))) {
    goto err;
  }
  if (LJ_LIKELY(tvisint(o))) {
    return (uint32_t)intV(o);
  } else {
    int32_t i = lj_num2bit(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return (uint32_t)i;
  }
}